

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O0

void setup_buffer_pool(AV1_COMMON *cm)

{
  long lVar1;
  int iVar2;
  long in_RDI;
  SequenceHeader *seq_params;
  BufferPool *pool;
  _Bool in_stack_00000093;
  int in_stack_00000094;
  int in_stack_00000098;
  int in_stack_0000009c;
  int in_stack_000000a0;
  int in_stack_000000a4;
  YV12_BUFFER_CONFIG *in_stack_000000a8;
  int in_stack_000000f0;
  int in_stack_000000f8;
  aom_codec_frame_buffer_t *in_stack_00000100;
  aom_get_frame_buffer_cb_fn_t in_stack_00000108;
  void *in_stack_00000110;
  int in_stack_00000120;
  
  lVar1 = *(long *)(in_RDI + 0x6088);
  lock_buffer_pool((BufferPool *)0x1b1f57);
  iVar2 = aom_realloc_frame_buffer
                    (in_stack_000000a8,in_stack_000000a4,in_stack_000000a0,in_stack_0000009c,
                     in_stack_00000098,in_stack_00000094,in_stack_000000f0,in_stack_000000f8,
                     in_stack_00000100,in_stack_00000108,in_stack_00000110,in_stack_00000093,
                     in_stack_00000120);
  if (iVar2 != 0) {
    unlock_buffer_pool((BufferPool *)0x1b2005);
    aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x30),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate frame buffer");
  }
  unlock_buffer_pool((BufferPool *)0x1b202b);
  *(undefined4 *)(*(long *)(in_RDI + 0xe8) + 0x578) = *(undefined4 *)(lVar1 + 0x48);
  *(undefined4 *)(*(long *)(in_RDI + 0xe8) + 0x57c) = *(undefined4 *)(lVar1 + 0x50);
  *(undefined4 *)(*(long *)(in_RDI + 0xe8) + 0x580) = *(undefined4 *)(lVar1 + 0x54);
  *(undefined4 *)(*(long *)(in_RDI + 0xe8) + 0x584) = *(undefined4 *)(lVar1 + 0x58);
  *(undefined1 *)(*(long *)(in_RDI + 0xe8) + 0x588) = *(undefined1 *)(lVar1 + 0x4d);
  *(undefined4 *)(*(long *)(in_RDI + 0xe8) + 0x58c) = *(undefined4 *)(lVar1 + 0x68);
  *(undefined4 *)(*(long *)(in_RDI + 0xe8) + 0x590) = *(undefined4 *)(lVar1 + 0x5c);
  *(undefined4 *)(*(long *)(in_RDI + 0xe8) + 0x594) = *(undefined4 *)(in_RDI + 0x40);
  *(undefined4 *)(*(long *)(in_RDI + 0xe8) + 0x598) = *(undefined4 *)(in_RDI + 0x44);
  return;
}

Assistant:

static inline void setup_buffer_pool(AV1_COMMON *cm) {
  BufferPool *const pool = cm->buffer_pool;
  const SequenceHeader *const seq_params = cm->seq_params;

  lock_buffer_pool(pool);
  if (aom_realloc_frame_buffer(
          &cm->cur_frame->buf, cm->width, cm->height, seq_params->subsampling_x,
          seq_params->subsampling_y, seq_params->use_highbitdepth,
          AOM_DEC_BORDER_IN_PIXELS, cm->features.byte_alignment,
          &cm->cur_frame->raw_frame_buffer, pool->get_fb_cb, pool->cb_priv,
          false, 0)) {
    unlock_buffer_pool(pool);
    aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                       "Failed to allocate frame buffer");
  }
  unlock_buffer_pool(pool);

  cm->cur_frame->buf.bit_depth = (unsigned int)seq_params->bit_depth;
  cm->cur_frame->buf.color_primaries = seq_params->color_primaries;
  cm->cur_frame->buf.transfer_characteristics =
      seq_params->transfer_characteristics;
  cm->cur_frame->buf.matrix_coefficients = seq_params->matrix_coefficients;
  cm->cur_frame->buf.monochrome = seq_params->monochrome;
  cm->cur_frame->buf.chroma_sample_position =
      seq_params->chroma_sample_position;
  cm->cur_frame->buf.color_range = seq_params->color_range;
  cm->cur_frame->buf.render_width = cm->render_width;
  cm->cur_frame->buf.render_height = cm->render_height;
}